

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace14.c
# Opt level: O2

Task * lace_get_head(WorkerP *self)

{
  ulong uVar1;
  Task *pTVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pTVar2 = self->dq;
  if (pTVar2->thief != (_Worker *)0x0) {
    if (pTVar2[1].thief == (_Worker *)0x0) {
      return pTVar2 + 1;
    }
    if (pTVar2[2].thief == (_Worker *)0x0) {
      return pTVar2 + 2;
    }
    if (pTVar2[3].thief == (_Worker *)0x0) {
      return pTVar2 + 3;
    }
    uVar5 = (long)self->end - (long)self->dq >> 7;
    uVar4 = 2;
    do {
      uVar3 = uVar4;
      uVar4 = uVar3 * 2;
      uVar1 = uVar5;
      if (uVar5 <= uVar4) break;
      uVar1 = uVar4;
    } while (pTVar2[uVar3 * 2].thief != (_Worker *)0x0);
    while (uVar4 = uVar1, uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
      uVar5 = uVar4 - uVar3 >> 1;
      uVar1 = uVar5 + uVar3;
      if (pTVar2[uVar1].thief != (_Worker *)0x0) {
        uVar3 = uVar5 + 1 + uVar3;
        uVar1 = uVar4;
      }
    }
    pTVar2 = pTVar2 + uVar3;
  }
  return pTVar2;
}

Assistant:

Task*
lace_get_head(WorkerP *self)
{
    Task *dq = self->dq;

    /* First check the first tasks linearly */
    if (dq[0].thief == 0) return dq;
    if (dq[1].thief == 0) return dq+1;
    if (dq[2].thief == 0) return dq+2;
    if (dq[3].thief == 0) return dq+3;

    /* Then fast search for a low/high bound using powers of 2: 4, 8, 16... */
    size_t low = 2;
    size_t high = self->end - self->dq;

    for (;;) {
        if (low*2 >= high) {
            break;
        } else if (dq[low*2].thief == 0) {
            high=low*2;
            break;
        } else {
            low*=2;
        }
    }

    /* Finally zoom in using binary search */
    while (low < high) {
        size_t mid = low + (high-low)/2;
        if (dq[mid].thief == 0) high = mid;
        else low = mid + 1;
    }

    return dq+low;
}